

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phashtable.c
# Opt level: O3

void p_hash_table_free(PHashTable *table)

{
  PHashTableNode *pPVar1;
  ulong uVar2;
  PHashTableNode *mem;
  ulong uVar3;
  
  if (table != (PHashTable *)0x0) {
    uVar2 = table->size;
    if (uVar2 != 0) {
      uVar3 = 0;
      do {
        mem = table->table[uVar3];
        if (table->table[uVar3] != (PHashTableNode *)0x0) {
          do {
            pPVar1 = mem->next;
            p_free(mem);
            mem = pPVar1;
          } while (pPVar1 != (PHashTableNode *)0x0);
          uVar2 = table->size;
        }
        uVar3 = (ulong)((int)uVar3 + 1);
      } while (uVar3 < uVar2);
    }
    p_free(table->table);
    p_free(table);
    return;
  }
  return;
}

Assistant:

P_LIB_API void
p_hash_table_free (PHashTable *table)
{
	PHashTableNode	*node;
	PHashTableNode	*next_node;
	puint		i;

	if (P_UNLIKELY (table == NULL))
		return;

	for (i = 0; i < table->size; ++i)
		for (node = table->table[i]; node != NULL; ) {
			next_node = node->next;
			p_free (node);
			node = next_node;
		}

	p_free (table->table);
	p_free (table);
}